

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeReturn(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this)

{
  Return *pRVar1;
  bool bVar2;
  Ok local_bd;
  uint local_bc;
  Err local_b8;
  Err *local_98;
  Err *err;
  Result<wasm::Ok> _val;
  Return curr;
  allocator<char> local_39;
  Err local_38;
  IRBuilder *local_18;
  IRBuilder *this_local;
  
  local_18 = this;
  this_local = (IRBuilder *)__return_storage_ptr__;
  if (this->func == (Function *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"return is only valid in a function context",&local_39);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_38);
    wasm::Err::~Err(&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  else {
    pRVar1 = (Return *)
             ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
    Return::Return(pRVar1);
    UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitReturn
              ((Result<wasm::Ok> *)&err,
               (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pRVar1);
    local_98 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
    bVar2 = local_98 != (Err *)0x0;
    if (bVar2) {
      wasm::Err::Err(&local_b8,local_98);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b8);
      wasm::Err::~Err(&local_b8);
    }
    local_bc = (uint)bVar2;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
    if (local_bc == 0) {
      pRVar1 = Builder::makeReturn(&this->builder,
                                   (Expression *)
                                   curr.super_SpecificExpression<(wasm::Expression::Id)19>.
                                   super_Expression.type.id);
      push(this,(Expression *)pRVar1);
      Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_bd);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeReturn() {
  if (!func) {
    return Err{"return is only valid in a function context"};
  }
  Return curr;
  CHECK_ERR(visitReturn(&curr));
  push(builder.makeReturn(curr.value));
  return Ok{};
}